

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall S2Builder::AddForcedSites(S2Builder *this,S2PointIndex<int> *site_index)

{
  S2PointIndex<int> *this_00;
  ulong uVar1;
  size_type sVar2;
  reference point;
  int local_64;
  iterator iStack_60;
  SiteId id;
  __normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
  local_58;
  const_iterator local_50;
  Vector3<double> *local_48;
  __normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
  local_40;
  __normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
  local_38;
  const_iterator local_30;
  Vector3<double> *local_28;
  __normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
  local_20;
  S2PointIndex<int> *local_18;
  S2PointIndex<int> *site_index_local;
  S2Builder *this_local;
  
  local_18 = site_index;
  site_index_local = (S2PointIndex<int> *)this;
  local_20._M_current =
       (Vector3<double> *)
       std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::begin(&this->sites_);
  local_28 = (Vector3<double> *)
             std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::end(&this->sites_);
  std::
  sort<__gnu_cxx::__normal_iterator<Vector3<double>*,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>>
            (local_20,(__normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
                       )local_28);
  local_40._M_current =
       (Vector3<double> *)
       std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::begin(&this->sites_);
  local_48 = (Vector3<double> *)
             std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::end(&this->sites_);
  local_38 = std::
             unique<__gnu_cxx::__normal_iterator<Vector3<double>*,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>>
                       (local_40,(__normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
                                  )local_48);
  __gnu_cxx::
  __normal_iterator<Vector3<double>const*,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
  ::__normal_iterator<Vector3<double>*>
            ((__normal_iterator<Vector3<double>const*,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
              *)&local_30,&local_38);
  local_58._M_current =
       (Vector3<double> *)
       std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::end(&this->sites_);
  __gnu_cxx::
  __normal_iterator<Vector3<double>const*,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
  ::__normal_iterator<Vector3<double>*>
            ((__normal_iterator<Vector3<double>const*,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
              *)&local_50,&local_58);
  iStack_60 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::erase
                        (&this->sites_,local_30,local_50);
  local_64 = 0;
  while( true ) {
    uVar1 = (ulong)local_64;
    sVar2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size(&this->sites_);
    this_00 = local_18;
    if (sVar2 <= uVar1) break;
    point = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                      (&this->sites_,(long)local_64);
    S2PointIndex<int>::Add(this_00,point,&local_64);
    local_64 = local_64 + 1;
  }
  sVar2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size(&this->sites_);
  this->num_forced_sites_ = (SiteId)sVar2;
  return;
}

Assistant:

void S2Builder::AddForcedSites(S2PointIndex<SiteId>* site_index) {
  // Sort the forced sites and remove duplicates.
  std::sort(sites_.begin(), sites_.end());
  sites_.erase(std::unique(sites_.begin(), sites_.end()), sites_.end());
  // Add the forced sites to the index.
  for (SiteId id = 0; id < sites_.size(); ++id) {
    site_index->Add(sites_[id], id);
  }
  num_forced_sites_ = sites_.size();
}